

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O2

string * __thiscall
Parameterization::GetName_abi_cxx11_(string *__return_storage_ptr__,Parameterization *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

string Parameterization::GetName() {
  return name;
}